

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::convertSwizzle
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle)

{
  TIntermSequence *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  const_reference ppTVar3;
  undefined4 extraout_var_00;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  value_type local_30;
  int local_2c;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvStack_28;
  int i;
  TIntermSequence *swizzleSequence;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle_local;
  TIntermAggregate *node_local;
  TGlslangToSpvTraverser *this_local;
  
  swizzleSequence = (TIntermSequence *)swizzle;
  swizzle_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)node;
  node_local = (TIntermAggregate *)this;
  iVar1 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])();
  pvStack_28 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var,iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    sVar2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvStack_28);
    this_00 = swizzleSequence;
    if ((int)sVar2 <= iVar1) break;
    ppTVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvStack_28,(long)local_2c);
    iVar1 = (*(*ppTVar3)->_vptr_TIntermNode[5])();
    this_01 = glslang::TIntermConstantUnion::getConstArray
                        ((TIntermConstantUnion *)CONCAT44(extraout_var_00,iVar1));
    this_02 = glslang::TConstUnionArray::operator[](this_01,0);
    local_30 = glslang::TConstUnion::getIConst(this_02);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_30);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::convertSwizzle(const glslang::TIntermAggregate& node, std::vector<unsigned>& swizzle)
{
    const glslang::TIntermSequence& swizzleSequence = node.getSequence();
    for (int i = 0; i < (int)swizzleSequence.size(); ++i)
        swizzle.push_back(swizzleSequence[i]->getAsConstantUnion()->getConstArray()[0].getIConst());
}